

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_communicate.hpp
# Opt level: O3

char * MPIX_NAP_unpack(char *packed_buf,int size,MPI_Datatype datatype,MPI_Comm comm)

{
  char *pcVar1;
  int iVar2;
  int ctr;
  int pack_size;
  int type_size;
  undefined4 local_3c;
  undefined4 local_38;
  int local_34;
  
  local_3c = 0;
  MPI_Type_size(datatype,&local_34);
  iVar2 = -1;
  if (-1 < local_34 * size) {
    iVar2 = local_34 * size;
  }
  pcVar1 = (char *)operator_new__((long)iVar2);
  MPI_Pack_size(size,datatype,comm,&local_38);
  MPI_Unpack(packed_buf,local_38,&local_3c,pcVar1,size,datatype,comm);
  return pcVar1;
}

Assistant:

static char* MPIX_NAP_unpack(char* packed_buf, int size, MPI_Datatype datatype, MPI_Comm comm)
{
    int type_size, pack_size;
    int ctr = 0;

    MPI_Type_size(datatype, &type_size);
    char* unpacked_buf = new char[size*type_size];

    MPI_Pack_size(size, datatype, comm, &pack_size);
    MPI_Unpack(packed_buf, pack_size, &ctr, unpacked_buf, size, datatype, comm);

    return unpacked_buf;
}